

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

void __thiscall AAmbientSound::Tick(AAmbientSound *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FAmbientSound *ambient;
  uint uVar5;
  uint uVar6;
  float volume;
  float fVar7;
  FSoundID local_20;
  FSoundID local_1c;
  
  AActor::Tick(&this->super_AActor);
  if (((this->super_AActor).field_0x4bc == '\x01') && (this->NextCheck <= level.maptime)) {
    ambient = TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::CheckKey
                        (&Ambients,(this->super_AActor).args[0]);
    if (ambient != (FAmbientSound *)0x0) {
      iVar1 = (ambient->sound).ID;
      uVar5 = ambient->type & 3;
      if (iVar1 == 0) {
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this,0);
        return;
      }
      iVar2 = (this->super_AActor).args[1];
      iVar3 = (this->super_AActor).args[2];
      fVar7 = 1.0;
      if (iVar2 != 0) {
        fVar7 = (float)iVar2 * 0.01;
      }
      uVar6 = (uint)(uVar5 == 3) << 8;
      fVar7 = fVar7 * ambient->volume;
      if (1.0 <= fVar7) {
        fVar7 = 1.0;
      }
      volume = 0.0;
      if (0.0 <= fVar7) {
        volume = fVar7;
      }
      iVar2 = (this->super_AActor).args[3];
      if (iVar2 < iVar3 || iVar2 == 0 && iVar3 == 0) {
        local_1c.ID = iVar1;
        S_Sound(&this->super_AActor,uVar6 | 4,&local_1c,volume,ambient->attenuation);
      }
      else {
        iVar4 = (this->super_AActor).args[4];
        if (iVar4 < 1) {
          fVar7 = 1.0;
        }
        else {
          fVar7 = (float)iVar4;
        }
        local_20.ID = iVar1;
        S_SoundMinMaxDist(&this->super_AActor,uVar6 | 4,&local_20,volume,(float)iVar3 * fVar7,
                          (float)iVar2 * fVar7);
      }
      if (uVar5 == 3) {
        this->NextCheck = 0x7fffffff;
      }
      else {
        SetTicker(this,ambient);
      }
    }
  }
  return;
}

Assistant:

void AAmbientSound::Tick ()
{
	Super::Tick ();

	if (!bActive || level.maptime < NextCheck)
		return;

	FAmbientSound *ambient;
	int loop = 0;

	ambient = Ambients.CheckKey(args[0]);
	if (ambient == NULL)
	{
		return;
	}

	if ((ambient->type & CONTINUOUS) == CONTINUOUS)
	{
		loop = CHAN_LOOP;
	}

	if (ambient->sound != FSoundID(0))
	{
		// The second argument scales the ambient sound's volume.
		// 0 and 100 are normal volume. The maximum volume level
		// possible is always 1.
		float volscale = args[1] == 0 ? 1 : args[1] / 100.f;
		float usevol = clamp(ambient->volume * volscale, 0.f, 1.f);

		// The third argument is the minimum distance for audible fading, and
		// the fourth argument is the maximum distance for audibility. Setting
		// either of these to 0 or setting  min distance > max distance will
		// use the standard rolloff.
		if ((args[2] | args[3]) == 0 || args[2] > args[3])
		{
			S_Sound(this, CHAN_BODY | loop, ambient->sound, usevol, ambient->attenuation);
		}
		else
		{
			float min = float(args[2]), max = float(args[3]);
			// The fifth argument acts as a scalar for the preceding two, if it's non-zero.
			if (args[4] > 0)
			{
				min *= args[4];
				max *= args[4];
			}
			S_SoundMinMaxDist(this, CHAN_BODY | loop, ambient->sound, usevol, min, max);
		}
		if (!loop)
		{
			SetTicker (ambient);
		}
		else
		{
			NextCheck = INT_MAX;
		}
	}
	else
	{
		Destroy ();
	}
}